

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void ResortStates(lemon *lemp)

{
  int iVar1;
  int iVar2;
  state **ppsVar3;
  state *psVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  action *ap;
  
  iVar6 = lemp->nstate;
  if (0 < (long)iVar6) {
    ppsVar3 = lemp->sorted;
    iVar1 = lemp->nrule;
    lVar9 = 0;
    do {
      psVar4 = ppsVar3[lVar9];
      psVar4->nNtAct = 0;
      psVar4->iTknOfst = -0x7fffffff;
      psVar4->nTknAct = 0;
      psVar4->iDfltReduce = iVar1;
      psVar4->iNtOfst = -0x7fffffff;
      for (ap = psVar4->ap; ap != (action *)0x0; ap = ap->next) {
        iVar5 = compute_action(lemp,ap);
        if (-1 < iVar5) {
          iVar2 = ap->sp->index;
          if (iVar2 < lemp->nterminal) {
            psVar4->nTknAct = psVar4->nTknAct + 1;
          }
          else if (iVar2 < lemp->nsymbol) {
            psVar4->nNtAct = psVar4->nNtAct + 1;
          }
          else {
            if ((psVar4->autoReduce != 0) && (psVar4->pDfltReduce != (rule *)(ap->x).stp)) {
              __assert_fail("stp->autoReduce==0 || stp->pDfltReduce==ap->x.rp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                            ,0x1264,"void ResortStates(struct lemon *)");
            }
            psVar4->iDfltReduce = iVar5 - (iVar1 + iVar6);
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar6);
  }
  qsort(lemp->sorted + 1,(long)(iVar6 + -1),8,stateResortCompare);
  iVar6 = lemp->nstate;
  uVar7 = (ulong)iVar6;
  if (0 < (long)uVar7) {
    ppsVar3 = lemp->sorted;
    uVar8 = 0;
    do {
      ppsVar3[uVar8]->statenum = (int)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  if (1 < iVar6) {
    do {
      iVar6 = (int)uVar7;
      if (lemp->sorted[(uVar7 & 0xffffffff) - 1]->autoReduce == 0) goto LAB_001084b2;
      uVar7 = (ulong)(iVar6 - 1);
    } while (2 < iVar6);
    iVar6 = 1;
  }
LAB_001084b2:
  lemp->nxstate = iVar6;
  return;
}

Assistant:

void ResortStates(struct lemon *lemp)
{
  int i;
  struct state *stp;
  struct action *ap;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    stp->nTknAct = stp->nNtAct = 0;
    stp->iDfltReduce = lemp->nrule;  /* Init dflt action to "syntax error" */
    stp->iTknOfst = NO_OFFSET;
    stp->iNtOfst = NO_OFFSET;
    for(ap=stp->ap; ap; ap=ap->next){
      int iAction = compute_action(lemp,ap);
      if( iAction>=0 ){
        if( ap->sp->index<lemp->nterminal ){
          stp->nTknAct++;
        }else if( ap->sp->index<lemp->nsymbol ){
          stp->nNtAct++;
        }else{
          assert( stp->autoReduce==0 || stp->pDfltReduce==ap->x.rp );
          stp->iDfltReduce = iAction - lemp->nstate - lemp->nrule;
        }
      }
    }
  }
  qsort(&lemp->sorted[1], lemp->nstate-1, sizeof(lemp->sorted[0]),
        stateResortCompare);
  for(i=0; i<lemp->nstate; i++){
    lemp->sorted[i]->statenum = i;
  }
  lemp->nxstate = lemp->nstate;
  while( lemp->nxstate>1 && lemp->sorted[lemp->nxstate-1]->autoReduce ){
    lemp->nxstate--;
  }
}